

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O2

ostream * ninx::lexer::token::operator<<(ostream *strm,Token *a)

{
  ostream *poVar1;
  string local_30 [32];
  
  (*a->_vptr_Token[3])(local_30);
  poVar1 = std::operator<<(strm,local_30);
  std::__cxx11::string::~string(local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream &strm, const Token &a) {
                    return strm << a.dump();
                }